

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

bool __thiscall QLayout::activate(QLayout *this)

{
  byte bVar1;
  QLayoutPrivate *this_00;
  long lVar2;
  long lVar3;
  QSize QVar4;
  QWidget *this_01;
  ushort uVar5;
  ushort uVar6;
  long in_FS_OFFSET;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    this_01 = (QWidget *)this;
    this_00 = *(QLayoutPrivate **)&this_01->field_0x8;
    bVar1 = this_00->field_0x8c;
    if (((bVar1 & 2) == 0) ||
       (this = *(QLayout **)&this_00->field_0x10, (QWidget *)this == (QWidget *)0x0)) {
      uVar5 = 0;
      goto LAB_002e35cb;
    }
  } while ((bVar1 & 1) == 0);
  uVar5 = 0;
  if ((bVar1 & 4) != 0) goto LAB_002e35cb;
  activateRecursiveHelper((QLayoutItem *)&this_01->super_QPaintDevice);
  lVar2 = *(long *)&((QWidget *)this)->field_0x8;
  if (*(long *)(lVar2 + 0x78) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)(*(long *)(lVar2 + 0x78) + 0x7c);
    uVar5 = uVar6 & 3;
    uVar6 = uVar6 & 0xc;
  }
  switch(this_00->constraint) {
  case SetDefaultConstraint:
    if (((((QWidget *)this)->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      if (uVar5 == 3) break;
      local_40 = QWidget::minimumSize((QWidget *)this);
      if ((uVar5 & 1) == 0) {
        local_40 = (QSize)((ulong)local_40 & 0xffffffff00000000);
      }
      if ((uVar5 & 2) == 0) {
        local_40 = (QSize)((ulong)local_40 & 0xffffffff);
      }
    }
    else {
      local_40 = totalMinimumSize((QLayout *)this_01);
      if ((uVar5 & 1) != 0) {
        QVar4 = QWidget::minimumSize((QWidget *)this);
        local_40.wd.m_i = QVar4.wd.m_i.m_i;
      }
      if ((uVar5 & 2) != 0) {
        QVar4 = QWidget::minimumSize((QWidget *)this);
        local_40.ht.m_i = QVar4.ht.m_i.m_i;
      }
    }
    goto LAB_002e370d;
  case SetMinimumSize:
    local_40 = totalMinimumSize((QLayout *)this_01);
LAB_002e370d:
    QWidget::setMinimumSize((QWidget *)this,&local_40);
    break;
  case SetFixedSize:
    local_40 = totalSizeHint((QLayout *)this_01);
    QWidget::setFixedSize((QWidget *)this,&local_40);
    break;
  case SetMaximumSize:
    local_40 = totalMaximumSize((QLayout *)this_01);
    goto LAB_002e36c9;
  case SetMinAndMaxSize:
    local_40 = totalMinimumSize((QLayout *)this_01);
    QWidget::setMinimumSize((QWidget *)this,&local_40);
    local_40 = totalMaximumSize((QLayout *)this_01);
LAB_002e36c9:
    QWidget::setMaximumSize((QWidget *)this,&local_40);
  }
  QLayoutPrivate::doResize(this_00);
  lVar3 = *(long *)(lVar2 + 0x78);
  if (lVar3 != 0) {
    *(ushort *)(lVar3 + 0x7c) = (ushort)*(undefined4 *)(lVar3 + 0x7c) & 0xfffc | uVar5;
    *(ushort *)(*(long *)(lVar2 + 0x78) + 0x7c) =
         uVar6 | (ushort)*(undefined4 *)(*(long *)(lVar2 + 0x78) + 0x7c) & 0xfff3;
  }
  QWidget::updateGeometry((QWidget *)this);
  uVar5 = 1;
LAB_002e35cb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB21(uVar5,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QLayout::activate()
{
    Q_D(QLayout);
    if (!d->enabled || !parent())
        return false;
    if (!d->topLevel)
        return static_cast<QLayout*>(parent())->activate();
    if (d->activated)
        return false;
    QWidget *mw = static_cast<QWidget*>(parent());
    if (Q_UNLIKELY(!mw)) {
        qWarning("QLayout::activate: %s \"%ls\" does not have a main widget",
                 metaObject()->className(), qUtf16Printable(objectName()));
        return false;
    }
    activateRecursiveHelper(this);

    QWidgetPrivate *md = mw->d_func();
    uint explMin = md->extra ? md->extra->explicitMinSize : 0;
    uint explMax = md->extra ? md->extra->explicitMaxSize : 0;

    switch (d->constraint) {
    case SetFixedSize:
        // will trigger resize
        mw->setFixedSize(totalSizeHint());
        break;
    case SetMinimumSize:
        mw->setMinimumSize(totalMinimumSize());
        break;
    case SetMaximumSize:
        mw->setMaximumSize(totalMaximumSize());
        break;
    case SetMinAndMaxSize:
        mw->setMinimumSize(totalMinimumSize());
        mw->setMaximumSize(totalMaximumSize());
        break;
    case SetDefaultConstraint: {
        bool widthSet = explMin & Qt::Horizontal;
        bool heightSet = explMin & Qt::Vertical;
        if (mw->isWindow()) {
            QSize ms = totalMinimumSize();
            if (widthSet)
                ms.setWidth(mw->minimumSize().width());
            if (heightSet)
                ms.setHeight(mw->minimumSize().height());
            mw->setMinimumSize(ms);
        } else if (!widthSet || !heightSet) {
            QSize ms = mw->minimumSize();
            if (!widthSet)
                ms.setWidth(0);
            if (!heightSet)
                ms.setHeight(0);
            mw->setMinimumSize(ms);
        }
        break;
    }
    case SetNoConstraint:
        break;
    }

    d->doResize();

    if (md->extra) {
        md->extra->explicitMinSize = explMin;
        md->extra->explicitMaxSize = explMax;
    }
    // ideally only if sizeHint() or sizePolicy() has changed
    mw->updateGeometry();
    return true;
}